

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyNestedEmphasis(TidyDocImpl *doc,Node *node)

{
  Node *local_20;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  next = node;
  node_local = &doc->root;
  while (next != (Node *)0x0) {
    local_20 = next->next;
    if (((((next == (Node *)0x0) || (next->tag == (Dict *)0x0)) || (next->tag->id != TidyTag_B)) &&
        (((next == (Node *)0x0 || (next->tag == (Dict *)0x0)) || (next->tag->id != TidyTag_I)))) ||
       ((next->parent == (Node *)0x0 || (next->parent->tag != next->tag)))) {
      if (next->content != (Node *)0x0) {
        prvTidyNestedEmphasis((TidyDocImpl *)node_local,next->content);
      }
      next = local_20;
    }
    else {
      DiscardContainer((TidyDocImpl *)node_local,next,&local_20);
      next = local_20;
    }
  }
  return;
}

Assistant:

void TY_(NestedEmphasis)( TidyDocImpl* doc, Node* node )
{
    Node *next;

    while (node)
    {
        next = node->next;

        if ( (nodeIsB(node) || nodeIsI(node))
             && node->parent && node->parent->tag == node->tag)
        {
            /* strip redundant inner element */
            DiscardContainer( doc, node, &next );
            node = next;
            continue;
        }

        if ( node->content )
            TY_(NestedEmphasis)( doc, node->content );

        node = next;
    }
}